

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O2

void __thiscall
ser::OffsetTable::AddFieldRecord
          (OffsetTable *this,int savepointID,string *fieldName,offset_t offset,checksum_t *checksum)

{
  pointer pmVar1;
  mapped_type *this_00;
  ostream *poVar2;
  SerializationException *this_01;
  string asStack_1e8 [32];
  SerializationException exception;
  OffsetTableEntryValue value;
  
  pmVar1 = (this->entries_).
           super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(uint)savepointID <
      (ulong)(((long)(this->entries_).
                     super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar1) / 0x30)) {
    value.checksum._M_dataplus._M_p = (pointer)&value.checksum.field_2;
    value.checksum._M_string_length = 0;
    value.checksum.field_2._M_local_buf[0] = '\0';
    value.offset = offset;
    std::__cxx11::string::_M_assign((string *)&value.checksum);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
              ::operator[](pmVar1 + savepointID,fieldName);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>
    ::anon_struct_40_2_0ce26ee9_for_second::operator=(this_00,&value);
    std::__cxx11::string::~string((string *)&value.checksum);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&value);
  poVar2 = std::operator<<((ostream *)&value,"Error: savepoint with ID ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,savepointID);
  poVar2 = std::operator<<(poVar2," is not registered in table\n");
  poVar2 = std::operator<<(poVar2,"Saving the field ");
  poVar2 = std::operator<<(poVar2,(string *)fieldName);
  poVar2 = std::operator<<(poVar2," at offset ");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::operator<<(poVar2," is not possible\n");
  exception.message_._M_dataplus._M_p = (pointer)&exception.message_.field_2;
  exception._0_8_ = &PTR__SerializationException_0018fa68;
  exception.message_._M_string_length = 0;
  exception.message_.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&exception.message_);
  std::__cxx11::string::~string(asStack_1e8);
  this_01 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_01,&exception);
  __cxa_throw(this_01,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

void OffsetTable::AddFieldRecord(int savepointID, const std::string& fieldName,
                                 offset_t offset, const checksum_t& checksum)
{
    // Check that ID is valid
    if (static_cast<unsigned>(savepointID) >= entries_.size())
    {
        std::ostringstream msg;
        msg << "Error: savepoint with ID " << savepointID << " is not registered in table\n"
            << "Saving the field " << fieldName << " at offset " << offset << " is not possible\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    // Find the right row of the table
    OffsetTableEntry& entry = entries_[savepointID];

    // Set the offset of the record
    // If the recod already exists, it is overwritten
    OffsetTableEntryValue value;
    value.offset = offset;
    value.checksum = checksum;
    entry[fieldName] = value;
}